

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

int __thiscall deqp::gls::ShaderLibraryCase::init(ShaderLibraryCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  NotSupportedError *this_00;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long extraout_RAX_02;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  long extraout_RAX_03;
  MessageBuilder local_7e8;
  MessageBuilder local_668;
  MessageBuilder local_4e8;
  MessageBuilder local_368;
  MessageBuilder local_1e8;
  undefined1 local_66;
  allocator<char> local_65 [13];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  ApiType local_14;
  ShaderLibraryCase *local_10;
  ShaderLibraryCase *this_local;
  
  local_10 = this;
  local_14.m_bits = (*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::isGLSLVersionSupported((ContextType)local_14.m_bits,(this->m_spec).targetVersion);
  if (bVar1) {
    checkImplementationLimits(&(this->m_spec).requiredCaps,this->m_contextInfo);
    uVar3 = (ulong)(this->m_spec).expectResult;
    lVar4 = uVar3 - 5;
    if (uVar3 < 5 || lVar4 == 0) {
      lVar4 = (long)&switchD_00c68dad::switchdataD_00f916e0 +
              (long)(int)(&switchD_00c68dad::switchdataD_00f916e0)[uVar3];
      switch(lVar4) {
      case 0xc68daf:
        break;
      case 0xc68db4:
        pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_1e8,(char (*) [38])"Expecting shader compilation to fail.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1e8);
        lVar4 = extraout_RAX;
        break;
      case 0xc68e40:
        pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_368,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_368,(char (*) [35])"Expecting program linking to fail.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_368);
        lVar4 = extraout_RAX_00;
        break;
      case 0xc68ecc:
        pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_4e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_4e8,
                            (char (*) [64])
                            "Expecting either shader compilation or program linking to fail.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_4e8);
        lVar4 = extraout_RAX_01;
        break;
      case 0xc68f58:
        pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_668,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_668,(char (*) [38])"Expecting program validation to fail.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_668);
        lVar4 = extraout_RAX_02;
        break;
      case 0xc68fe4:
        pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_7e8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_7e8,
                            (char (*) [101])
                            "Expecting shader compilation and program linking to succeed. Resulting program will not be executed."
                           );
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_7e8);
        lVar4 = extraout_RAX_03;
      }
    }
    return (int)lVar4;
  }
  local_66 = 1;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  pcVar2 = glu::getGLSLVersionName((this->m_spec).targetVersion);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar2,local_65);
  std::operator+(&local_38,&local_58," is not supported");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  tcu::NotSupportedError::NotSupportedError
            (this_00,pcVar2,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderLibraryCase.cpp"
             ,0x2dc);
  local_66 = 0;
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void ShaderLibraryCase::init (void)
{
	DE_ASSERT(isValid(m_spec));

	if (!isGLSLVersionSupported(m_renderCtx.getType(), m_spec.targetVersion))
		TCU_THROW(NotSupportedError, (string(getGLSLVersionName(m_spec.targetVersion)) + " is not supported").c_str());

	checkImplementationLimits(m_spec.requiredCaps, m_contextInfo);

	// log the expected result
	switch (m_spec.expectResult)
	{
		case EXPECT_PASS:
			// Don't write anything
			break;

		case EXPECT_COMPILE_FAIL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting shader compilation to fail." << tcu::TestLog::EndMessage;
			break;

		case EXPECT_LINK_FAIL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting program linking to fail." << tcu::TestLog::EndMessage;
			break;

		case EXPECT_COMPILE_LINK_FAIL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting either shader compilation or program linking to fail." << tcu::TestLog::EndMessage;
			break;

		case EXPECT_VALIDATION_FAIL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting program validation to fail." << tcu::TestLog::EndMessage;
			break;

		case EXPECT_BUILD_SUCCESSFUL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting shader compilation and program linking to succeed. Resulting program will not be executed." << tcu::TestLog::EndMessage;
			break;

		default:
			DE_ASSERT(false);
			break;
	}
}